

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::_process_config_file(App *this,string *config_file,bool throw_error)

{
  bool bVar1;
  path_type pVar2;
  FileError *__return_storage_ptr__;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  string local_40;
  
  pVar2 = CLI::detail::check_path((config_file->_M_dataplus)._M_p);
  if (pVar2 == file) {
    Config::from_file(&values,(this->config_formatter_).
                              super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      config_file);
    _parse_config(this,&values);
    std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector(&values);
    bVar1 = true;
  }
  else {
    if (throw_error) {
      __return_storage_ptr__ = (FileError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_40,config_file);
      FileError::Missing(__return_storage_ptr__,&local_40);
      __cxa_throw(__return_storage_ptr__,&FileError::typeinfo,Error::~Error);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

CLI11_INLINE bool App::_process_config_file(const std::string &config_file, bool throw_error) {
    auto path_result = detail::check_path(config_file.c_str());
    if(path_result == detail::path_type::file) {
        try {
            std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
            _parse_config(values);
            return true;
        } catch(const FileError &) {
            if(throw_error) {
                throw;
            }
            return false;
        }
    } else if(throw_error) {
        throw FileError::Missing(config_file);
    } else {
        return false;
    }
}